

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionRewind.h
# Opt level: O1

void __thiscall Hpipe::InstructionRewind::~InstructionRewind(InstructionRewind *this)

{
  pointer puVar1;
  void *pvVar2;
  pointer pCVar3;
  
  (this->super_Instruction)._vptr_Instruction = (_func_int **)&PTR__InstructionRewind_0019a798;
  puVar1 = (this->ncx).second.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->ncx).second.
                                 super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>_>
  ::~_Rb_tree(&(this->ncx).first.paths_to_strings._M_t);
  puVar1 = (this->ncx).first.paths_to_mark.super_vector<unsigned_int,_std::allocator<unsigned_int>_>
           .super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)*(pointer *)
                                  ((long)&(this->ncx).first.paths_to_mark.
                                          super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data + 0x10) - (long)puVar1);
  }
  pvVar2 = (this->ncx).first.pos.
           super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
           super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)*(pointer *)
                                  ((long)&(this->ncx).first.pos.
                                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                          .
                                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                          ._M_impl.super__Vector_impl_data + 0x10) - (long)pvVar2);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->strs_to_cancel).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  pCVar3 = (this->code_seq_end).
           super_vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
           .
           super__Vector_base<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pCVar3 != (pointer)0x0) {
    operator_delete(pCVar3,(long)(this->code_seq_end).
                                 super_vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                                 .
                                 super__Vector_base<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pCVar3);
  }
  pCVar3 = (this->code_seq_beg).
           super_vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
           .
           super__Vector_base<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pCVar3 != (pointer)0x0) {
    operator_delete(pCVar3,(long)(this->code_seq_beg).
                                 super_vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                                 .
                                 super__Vector_base<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pCVar3);
  }
  Instruction::~Instruction(&this->super_Instruction);
  return;
}

Assistant:

CodeSeqItem( unsigned offset, InstructionWithCode *code ) : offset( offset ), code( code ) {}